

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_char(lua_State *L)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  luaL_Buffer b;
  luaL_Buffer local_450;
  
  uVar1 = lua_gettop(L);
  pcVar2 = luaL_buffinitsize(L,&local_450,(ulong)uVar1);
  if (0 < (int)uVar1) {
    uVar4 = 1;
    do {
      uVar3 = luaL_checkinteger(L,(int)uVar4);
      if (0xff < uVar3) {
        luaL_argerror(L,(int)uVar4,"value out of range");
      }
      pcVar2[uVar4 - 1] = (char)uVar3;
      uVar4 = uVar4 + 1;
    } while (uVar1 + 1 != uVar4);
  }
  luaL_pushresultsize(&local_450,(ulong)uVar1);
  return 1;
}

Assistant:

static int str_char (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  int i;
  luaL_Buffer b;
  char *p = luaL_buffinitsize(L, &b, cast_uint(n));
  for (i=1; i<=n; i++) {
    lua_Unsigned c = (lua_Unsigned)luaL_checkinteger(L, i);
    luaL_argcheck(L, c <= (lua_Unsigned)UCHAR_MAX, i, "value out of range");
    p[i - 1] = cast_char(cast_uchar(c));
  }
  luaL_pushresultsize(&b, cast_uint(n));
  return 1;
}